

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

QAbstractButton * __thiscall QWizard::button(QWizard *this,WizardButton which)

{
  QWizardPrivate *this_00;
  bool bVar1;
  QAbstractButton *pQVar2;
  
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar1 = QWizardPrivate::ensureButton(this_00,which);
  if (bVar1) {
    pQVar2 = *(QAbstractButton **)((long)&this_00->field_20 + (long)which * 8);
  }
  else {
    pQVar2 = (QAbstractButton *)0x0;
  }
  return pQVar2;
}

Assistant:

QAbstractButton *QWizard::button(WizardButton which) const
{
    Q_D(const QWizard);
#if QT_CONFIG(style_windowsvista)
    if (d->wizStyle == AeroStyle && which == BackButton)
        return d->vistaHelper->backButton();
#endif
    if (!d->ensureButton(which))
        return nullptr;
    return d->btns[which];
}